

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O0

bool dg::llvmdg::anon_unknown_2::callIsCompatible(Function *F,CallInst *CI,CallCompatibility policy)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  const_arg_iterator pAVar6;
  Value *this;
  Type *pTVar7;
  int in_EDX;
  Value *in_RSI;
  Function *in_RDI;
  Type *ATy;
  Type *CTy;
  const_arg_iterator E;
  const_arg_iterator A;
  size_t idx;
  uint max_idx;
  uint in_stack_ffffffffffffffac;
  Type *in_stack_ffffffffffffffb0;
  Value *local_30;
  ulong local_28;
  
  uVar3 = llvm::CallBase::arg_size((CallBase *)in_stack_ffffffffffffffb0);
  if (in_EDX != 2) {
    bVar2 = llvm::Function::isVarArg((Function *)0x16ce15);
    if (bVar2) {
      sVar4 = llvm::Function::arg_size(in_RDI);
      if (uVar3 < sVar4) {
        return false;
      }
    }
    else {
      sVar4 = llvm::Function::arg_size(in_RDI);
      if ((sVar4 != uVar3) &&
         ((in_EDX == 0 || (sVar4 = llvm::Function::arg_size(in_RDI), uVar3 < sVar4)))) {
        return false;
      }
    }
    in_stack_ffffffffffffffb0 = llvm::Function::getReturnType((Function *)0x16ce7f);
    llvm::Value::getType(in_RSI);
    uVar5 = llvm::Type::canLosslesslyBitCastTo(in_stack_ffffffffffffffb0);
    if ((uVar5 & 1) == 0) {
      llvm::Function::getReturnType((Function *)0x16cea9);
      bVar2 = isPointerOrIntegerTy(in_stack_ffffffffffffffb0);
      if (bVar2) {
        llvm::Value::getType(in_RSI);
        bVar2 = isPointerOrIntegerTy(in_stack_ffffffffffffffb0);
        if (bVar2) goto LAB_0016cedb;
      }
      return false;
    }
  }
LAB_0016cedb:
  local_28 = 0;
  local_30 = (Value *)llvm::Function::arg_begin((Function *)in_stack_ffffffffffffffb0);
  pAVar6 = llvm::Function::arg_end((Function *)in_stack_ffffffffffffffb0);
  while( true ) {
    uVar1 = in_stack_ffffffffffffffac & 0xffffff;
    if (local_28 < uVar3) {
      uVar1 = CONCAT13(local_30 != (Value *)pAVar6,(int3)in_stack_ffffffffffffffac);
    }
    in_stack_ffffffffffffffac = uVar1;
    if ((char)(in_stack_ffffffffffffffac >> 0x18) == '\0') break;
    this = llvm::CallBase::getArgOperand
                     ((CallBase *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    pTVar7 = llvm::Value::getType(this);
    llvm::Value::getType(local_30);
    bVar2 = isPointerOrIntegerTy(in_stack_ffffffffffffffb0);
    if (((!bVar2) || (bVar2 = isPointerOrIntegerTy(in_stack_ffffffffffffffb0), !bVar2)) &&
       (uVar5 = llvm::Type::canLosslesslyBitCastTo(pTVar7), (uVar5 & 1) == 0)) {
      return false;
    }
    local_30 = local_30 + 0x28;
    local_28 = local_28 + 1;
  }
  return true;
}

Assistant:

inline bool
callIsCompatible(const llvm::Function *F, const llvm::CallInst *CI,
                 CallCompatibility policy = CallCompatibility::LOOSE) {
    using namespace llvm;

#if LLVM_VERSION_MAJOR >= 8
    auto max_idx = CI->arg_size();
#else
    auto max_idx = CI->getNumArgOperands();
#endif

    if (policy != CallCompatibility::MATCHING_ARGS) {
        if (F->isVarArg()) {
            if (F->arg_size() > max_idx) {
                return false;
            }
        } else if (F->arg_size() != max_idx) {
            if (policy == CallCompatibility::STRICT ||
                F->arg_size() > max_idx) {
                // too few arguments
                return false;
            }
        }

        if (!F->getReturnType()->canLosslesslyBitCastTo(CI->getType())) {
            // it showed up that the loosless bitcast is too strict
            // alternative since we can use the constexpr castings
            if (!(isPointerOrIntegerTy(F->getReturnType()) &&
                  isPointerOrIntegerTy(CI->getType()))) {
                return false;
            }
        }
    }

    size_t idx = 0;
    for (auto A = F->arg_begin(), E = F->arg_end(); idx < max_idx && A != E;
         ++A, ++idx) {
        Type *CTy = CI->getArgOperand(idx)->getType();
        Type *ATy = A->getType();

        if (!(isPointerOrIntegerTy(CTy) && isPointerOrIntegerTy(ATy)))
            if (!CTy->canLosslesslyBitCastTo(ATy)) {
                return false;
            }
    }

    return true;
}